

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

bool __thiscall Assembler::checkIfWord(Assembler *this,string *line)

{
  bool bVar1;
  bool bVar2;
  undefined8 *puVar3;
  Assembler *this_00;
  string *this_01;
  string substr;
  smatch word;
  string data;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream ss;
  int aiStack_198 [90];
  
  word.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  word._M_begin._M_current = (char *)0x0;
  word.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  word.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  data._M_dataplus._M_p = (pointer)&data.field_2;
  data._M_string_length = 0;
  data.field_2._M_local_buf[0] = '\0';
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (line,&word,&wordDirectiveReg_abi_cxx11_,0);
  if (bVar1) {
    bVar2 = std::operator==(&currentSectionName_abi_cxx11_,"");
    if (bVar2) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = &PTR__exception_0012b938;
      __cxa_throw(puVar3,&WordSectionError::typeinfo,std::exception::~exception);
    }
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str((string_type *)&ss,&word,1);
    std::__cxx11::string::operator=((string *)&data,(string *)&ss);
    std::__cxx11::string::~string((string *)&ss);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&data,_S_out|_S_in);
    while (*(int *)((long)aiStack_198 + *(long *)(_ss + -0x18)) == 0) {
      substr._M_dataplus._M_p = (pointer)&substr.field_2;
      substr._M_string_length = 0;
      substr.field_2._M_local_buf[0] = '\0';
      this_00 = (Assembler *)&substr;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&ss,(string *)&substr,',');
      removeSpaces(&local_1d8,this_00,&substr);
      std::__cxx11::string::operator=((string *)&substr,(string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      if (first == true) {
        std::__cxx11::string::string((string *)&local_1f8,(string *)&substr);
        this->isLabelWithoutCode = false;
        isGlobalFirst = false;
        locationCounter = locationCounter + 2;
        this_01 = &local_1f8;
      }
      else {
        std::__cxx11::string::string((string *)&local_218,(string *)&substr);
        processWordSecondPass(this,&local_218);
        this_01 = &local_218;
      }
      std::__cxx11::string::~string((string *)this_01);
      std::__cxx11::string::~string((string *)&substr);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  std::__cxx11::string::~string((string *)&data);
  std::
  _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&word);
  return bVar1;
}

Assistant:

bool Assembler::checkIfWord(string line) {
    smatch word;
    string data;
    if (regex_match(line, word, wordDirectiveReg)) {
        if (currentSectionName == "") throw WordSectionError();
        data = word.str(1);
        stringstream ss(data);
        while (ss.good()) {
            string substr;
            getline(ss, substr, ',');
            substr = removeSpaces(substr);
            if (first) processWordFirstPass(substr);
            else processWordSecondPass(substr);
        }
        return true;
    }


    return false;
}